

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O0

int Silent_PAL_vfprintf(PAL_FILE *stream,char *format,__va_list_tag *aparg)

{
  long lVar1;
  void *pvVar2;
  undefined8 uVar3;
  LPWSTR pvBuffer;
  BOOL BVar4;
  int iVar5;
  int iVar6;
  INT IVar7;
  long in_FS_OFFSET;
  undefined4 *local_638;
  undefined4 *local_620;
  undefined8 *local_608;
  undefined8 *local_5e8;
  INT *local_5c8;
  INT *local_5b0;
  undefined4 *local_598;
  undefined8 *local_550;
  INT *local_520;
  INT *local_4f0;
  undefined1 auStack_4d8 [8];
  va_list apcopy;
  short s;
  int n;
  short trunc2;
  long trunc1;
  undefined1 auStack_498 [4];
  CHAR TempBuffer [4];
  va_list ap;
  int local_478;
  int paddingReturnValue;
  int written;
  int wctombResult;
  INT TempInt;
  INT Length;
  INT Type;
  INT Prefix;
  INT Precision;
  INT Width;
  INT Flags;
  WCHAR TempWChar;
  LPSTR TempStr;
  LPWSTR TempWStr;
  LPCSTR Fmt;
  __va_list_tag *aparg_local;
  char *format_local;
  PAL_FILE *stream_local;
  CHAR local_418 [8];
  CHAR TempBuff [1024];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_478 = 0;
  pvVar2 = aparg->reg_save_area;
  auStack_498 = (undefined1  [4])aparg->gp_offset;
  TempBuffer = (CHAR  [4])aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  TempWStr = (LPWSTR)format;
  Fmt = (LPCSTR)aparg;
  aparg_local = (__va_list_tag *)format;
  format_local = (char *)stream;
LAB_0037d821:
  do {
    if ((char)*TempWStr == '\0') {
      stream_local._4_4_ = local_478;
LAB_0037e3e5:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return stream_local._4_4_;
    }
    if (((char)*TempWStr == '%') &&
       (BVar4 = Silent_ExtractFormatA
                          ((LPCSTR *)&TempWStr,local_418,&Precision,&Prefix,&Type,&Length,&TempInt),
       uVar3 = _auStack_498, BVar4 == 1)) {
      if ((Length == 2) && (TempInt == 2)) {
        if (Prefix == -2) {
          if ((uint)auStack_498 < 0x29) {
            local_4f0 = (INT *)((long)(int)auStack_498 + (long)pvVar2);
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            local_4f0 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Prefix = *local_4f0;
        }
        else if (Prefix == -3) {
          if ((uint)auStack_498 < 0x29) {
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if (Type == -2) {
          if ((uint)auStack_498 < 0x29) {
            local_520 = (INT *)((long)(int)auStack_498 + (long)pvVar2);
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            local_520 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Type = *local_520;
        }
        else if (Type == -4) {
          if ((uint)auStack_498 < 0x29) {
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((uint)auStack_498 < 0x29) {
          local_550 = (undefined8 *)((long)(int)auStack_498 + (long)pvVar2);
          auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
        }
        else {
          local_550 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        TempStr = (LPSTR)*local_550;
        iVar5 = Silent_WideCharToMultiByte((LPCWSTR)TempStr,-1,(LPSTR)0x0,0);
        if (iVar5 == 0) {
          stream_local._4_4_ = -1;
          goto LAB_0037e3e5;
        }
        _Flags = (LPSTR)PAL_malloc((long)iVar5);
        if (_Flags == (LPSTR)0x0) {
          stream_local._4_4_ = -1;
          goto LAB_0037e3e5;
        }
        if (Type == -3) {
          *_Flags = '\0';
          wctombResult = 0;
        }
        else if ((Type < 1) || (iVar5 + -1 <= Type)) {
          iVar6 = Silent_WideCharToMultiByte((LPCWSTR)TempStr,-1,_Flags,iVar5);
          if (iVar6 == 0) {
            PAL_free(_Flags);
            stream_local._4_4_ = -1;
            goto LAB_0037e3e5;
          }
          wctombResult = iVar5 + -1;
        }
        else {
          iVar5 = Silent_WideCharToMultiByte((LPCWSTR)TempStr,Type,_Flags,iVar5);
          if (iVar5 == 0) {
            PAL_free(_Flags);
            stream_local._4_4_ = -1;
            goto LAB_0037e3e5;
          }
          _Flags[iVar5] = '\0';
          wctombResult = Type;
        }
        IVar7 = Silent_AddPaddingVfprintf
                          ((PAL_FILE *)format_local,_Flags,Prefix - wctombResult,Precision);
        if (IVar7 == -1) {
          PAL_free(_Flags);
          stream_local._4_4_ = -1;
          goto LAB_0037e3e5;
        }
        local_478 = IVar7 + local_478;
        PAL_free(_Flags);
      }
      else if ((Length == 2) && (TempInt == 1)) {
        if ((Prefix == -2) || (Prefix == -3)) {
          if ((uint)auStack_498 < 0x29) {
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((Type == -2) || (Type == -4)) {
          if ((uint)auStack_498 < 0x29) {
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((uint)auStack_498 < 0x29) {
          local_598 = (undefined4 *)((long)(int)auStack_498 + (long)pvVar2);
          auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
        }
        else {
          local_598 = (undefined4 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Width._2_2_ = (undefined2)*local_598;
        iVar5 = Silent_WideCharToMultiByte
                          ((LPCWSTR)((long)&Width + 2),1,(LPSTR)((long)&trunc1 + 4),4);
        if (iVar5 == 0) {
          stream_local._4_4_ = -1;
          goto LAB_0037e3e5;
        }
        *(undefined1 *)((long)&trunc1 + (long)iVar5 + 4) = 0;
        IVar7 = Silent_AddPaddingVfprintf
                          ((PAL_FILE *)format_local,(LPSTR)((long)&trunc1 + 4),Prefix - iVar5,
                           Precision);
        if (IVar7 == -1) {
          stream_local._4_4_ = -1;
          goto LAB_0037e3e5;
        }
        local_478 = IVar7 + local_478;
      }
      else if (TempInt == 6) {
        if (Prefix == -2) {
          if ((uint)auStack_498 < 0x29) {
            local_5b0 = (INT *)((long)(int)auStack_498 + (long)pvVar2);
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            local_5b0 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Prefix = *local_5b0;
        }
        if (Type == -2) {
          if ((uint)auStack_498 < 0x29) {
            local_5c8 = (INT *)((long)(int)auStack_498 + (long)pvVar2);
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            local_5c8 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Type = *local_5c8;
        }
        if (Length == 1) {
          if ((uint)auStack_498 < 0x29) {
            local_5e8 = (undefined8 *)((long)(int)auStack_498 + (long)pvVar2);
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            local_5e8 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*local_5e8 = (short)local_478;
        }
        else {
          if ((uint)auStack_498 < 0x29) {
            local_608 = (undefined8 *)((long)(int)auStack_498 + (long)pvVar2);
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            local_608 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*local_608 = local_478;
        }
      }
      else {
        if ((TempInt == 5) && (Length == 1)) {
          if ((uint)auStack_498 < 0x29) {
            local_620 = (undefined4 *)((long)(int)auStack_498 + (long)pvVar2);
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            local_620 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          written = fprintf((FILE *)format_local,local_418,(ulong)(uint)(int)(short)*local_620);
        }
        else if ((TempInt == 4) && (Length == 1)) {
          if ((uint)auStack_498 < 0x29) {
            local_638 = (undefined4 *)((long)(int)auStack_498 + (long)pvVar2);
            auStack_498 = (undefined1  [4])((int)auStack_498 + 8);
          }
          else {
            local_638 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          written = fprintf((FILE *)format_local,local_418,(ulong)(uint)(int)(short)*local_638);
        }
        else {
          auStack_4d8._0_4_ = auStack_498;
          auStack_4d8[4] = TempBuffer[0];
          auStack_4d8[5] = TempBuffer[1];
          auStack_4d8[6] = TempBuffer[2];
          auStack_4d8[7] = TempBuffer[3];
          apcopy[0].gp_offset = ap[0].gp_offset;
          apcopy[0].fp_offset = ap[0].fp_offset;
          apcopy[0].overflow_arg_area = pvVar2;
          _auStack_498 = uVar3;
          written = PAL_vfprintf((PAL_FILE *)format_local,local_418,(__va_list_tag *)auStack_4d8);
          PAL_printf_arg_remover((va_list *)auStack_498,Prefix,Type,TempInt,Length);
        }
        if (written != -1) {
          local_478 = written + local_478;
        }
      }
      goto LAB_0037d821;
    }
    pvBuffer = TempWStr;
    TempWStr = (LPWSTR)((long)TempWStr + 1);
    PAL_fwrite(pvBuffer,1,1,(PAL_FILE *)format_local);
    if (*(int *)(format_local + 8) == 1) {
      stream_local._4_4_ = -1;
      goto LAB_0037e3e5;
    }
    local_478 = local_478 + 1;
  } while( true );
}

Assistant:

int Silent_PAL_vfprintf(PAL_FILE *stream, const char *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCSTR Fmt = format;
    LPWSTR TempWStr;
    LPSTR TempStr;
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    int written = 0;
    int paddingReturnValue;
    va_list ap;
    
    va_copy(ap, aparg);

    while (*Fmt)
    {
        if (*Fmt == '%' &&
            TRUE == Silent_ExtractFormatA(&Fmt, TempBuff, &Flags, &Width, 
                                          &Precision, &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = Silent_WideCharToMultiByte(TempWStr, -1, 0, 0);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempStr = (LPSTR) PAL_malloc(Length);
                if (!TempStr)
                {
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = Silent_WideCharToMultiByte(TempWStr, Precision, 
                                                        TempStr, Length);
                    if (!Length)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = Silent_WideCharToMultiByte(TempWStr, -1, 
                                                              TempStr, Length);
                    if (!wctombResult)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Silent_AddPaddingVfprintf(stream, TempStr, Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    PAL_free(TempStr);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

                PAL_free(TempStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[4];
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = Silent_WideCharToMultiByte(&TempWChar, 1, TempBuffer, 4);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Silent_AddPaddingVfprintf(stream, TempBuffer,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            /* types that sprintf can handle */
            else
            {
                TempInt = 0;

                /* %h (short) doesn't seem to be handled properly by local sprintf,
                   so lets do the truncation ourselves.  (ptr -> int -> short to avoid
                   warnings */
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;

                    TempInt = fprintf((FILE*)stream, TempBuff, trunc2);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short)n;

                    TempInt = fprintf((FILE*)stream, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = PAL_vfprintf(stream, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (-1 != TempInt)
                {
                    written += TempInt;
                }
            }
        }
        else
        {
#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
            clearerr((FILE*)stream);
#endif

            PAL_fwrite(Fmt++, 1, 1, stream); /* copy regular chars into buffer */
            if (stream->PALferrorCode == PAL_FILE_ERROR)
            {
                va_end(ap);
                return -1;
            }
            ++written;
        }
    }

    va_end(ap);
    return written;
}